

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineTest.cpp
# Opt level: O2

void __thiscall
(anonymous_namespace)::BuildEngineTest_discoveredDependencies_Test::TestBody()::
TaskWithDiscoveredDependency::start(llbuild::core::TaskInterface_(void *this,TaskInterface ti)

{
  TaskInterface local_40;
  KeyType local_30;
  
  local_40.ctx = ti.ctx;
  local_40.impl = ti.impl;
  llbuild::core::KeyType::KeyType(&local_30,"value-A");
  llbuild::core::TaskInterface::request(&local_40,&local_30,0);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

virtual void start(TaskInterface ti) override {
      // Request the known input.
      ti.request("value-A", 0);
    }